

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

float128 floatx80_to_float128(floatx80 a)

{
  commonNaNT a_00;
  int32 iVar1;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  bits64 in_stack_ffffffffffffffa0;
  bits64 local_58;
  bits64 local_50;
  bits64 local_48;
  bits64 zSig1;
  bits64 zSig0;
  bits64 aSig;
  ushort local_28;
  int16 aExp;
  flag aSign;
  floatx80 a_local;
  
  a_01.low = a.low;
  local_28 = a.high;
  a_01._2_6_ = 0;
  a_01.high = local_28;
  a_local._0_8_ = a_01.low;
  zSig0 = extractFloatx80Frac(a_01);
  a_02._2_6_ = 0;
  a_02.high = local_28;
  a_02.low = a_local._0_8_;
  iVar1 = extractFloatx80Exp(a_02);
  aSig._4_2_ = (short)iVar1;
  a_03._2_6_ = 0;
  a_03.high = local_28;
  a_03.low = a_local._0_8_;
  aSig._7_1_ = extractFloatx80Sign(a_03);
  if ((aSig._4_2_ == 0x7fff) && ((zSig0 & 0x7fffffffffffffff) != 0)) {
    a_04._2_6_ = 0;
    a_04.high = local_28;
    a_04.low = a_local._0_8_;
    floatx80ToCommonNaN((commonNaNT *)&stack0xffffffffffffffa0,a_04);
    a_00.high = local_50;
    a_00._0_8_ = local_58;
    a_00.low = in_stack_ffffffffffffffa0;
    join_0x00000010_0x00000000_ = commonNaNToFloat128(a_00);
  }
  else {
    shift128Right(zSig0 << 1,0,0x10,&zSig1,&local_48);
    join_0x00000010_0x00000000_ = packFloat128(aSig._7_1_,(int)aSig._4_2_,zSig1,local_48);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 floatx80_to_float128( floatx80 a )
{
	flag aSign;
	int16 aExp;
	bits64 aSig, zSig0, zSig1;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	if ( ( aExp == 0x7FFF ) && (bits64) ( aSig<<1 ) ) {
		return commonNaNToFloat128( floatx80ToCommonNaN( a ) );
	}
	shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
	return packFloat128( aSign, aExp, zSig0, zSig1 );

}